

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_split_ratio(REF_INT number_of_partitions,REF_DBL *ratio)

{
  int iVar1;
  undefined8 local_38;
  undefined8 local_28;
  REF_INT half;
  REF_DBL *ratio_local;
  REF_INT number_of_partitions_local;
  
  iVar1 = number_of_partitions / 2;
  if ((double)number_of_partitions * 1e+20 <= 0.0) {
    local_28 = -((double)number_of_partitions * 1e+20);
  }
  else {
    local_28 = (double)number_of_partitions * 1e+20;
  }
  if ((double)iVar1 <= 0.0) {
    local_38 = -(double)iVar1;
  }
  else {
    local_38 = (double)iVar1;
  }
  if (local_28 <= local_38) {
    *ratio = 0.0;
    ratio_local._4_4_ = 4;
  }
  else {
    *ratio = (double)iVar1 / (double)number_of_partitions;
    ratio_local._4_4_ = 0;
  }
  return ratio_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_split_ratio(REF_INT number_of_partitions,
                                           REF_DBL *ratio) {
  REF_INT half = number_of_partitions / 2;
  if (ref_math_divisible((REF_DBL)half, (REF_DBL)number_of_partitions)) {
    *ratio = (REF_DBL)half / (REF_DBL)number_of_partitions;
  } else {
    *ratio = 0;
    return REF_DIV_ZERO;
  }
  return REF_SUCCESS;
}